

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

self * __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::def<bool(AbstractModuleClient::*)(GlobalStimulationCommand)>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,first_type f)

{
  def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  *in_RCX;
  undefined8 local_70;
  first_type local_68 [2];
  undefined8 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 local_10 [8];
  
  local_58 = &local_70;
  local_70 = 0;
  local_50 = local_10;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_68[0] = f;
  local_48 = local_50;
  local_40 = local_50;
  def_impl<AbstractModuleClient,bool(AbstractModuleClient::*)(GlobalStimulationCommand),boost::python::detail::def_helper<char_const*,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (this,(AbstractModuleClient *)0x0,name,f,in_RCX,&local_58,local_68);
  return (self *)this;
}

Assistant:

self& def(char const* name, F f)
    {
        this->def_impl(
            detail::unwrap_wrapper((W*)0)
          , name, f, detail::def_helper<char const*>(0), &f);
        return *this;
    }